

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanStreamEnd(Scanner *this)

{
  Token local_48;
  
  if (this->Column != 0) {
    this->Column = 0;
    this->Line = this->Line + 1;
  }
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  local_48.Value._M_dataplus._M_p = (pointer)&local_48.Value.field_2;
  local_48.Value._M_string_length = 0;
  local_48.Value.field_2._M_local_buf[0] = '\0';
  local_48.Kind = TK_StreamEnd;
  local_48.Range.Data = this->Current;
  local_48.Range.Length = 0;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_48);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanStreamEnd() {
  // Force an ending new line if one isn't present.
  if (Column != 0) {
    Column = 0;
    ++Line;
  }

  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  Token T;
  T.Kind = Token::TK_StreamEnd;
  T.Range = StringRef(Current, 0);
  TokenQueue.push_back(T);
  return true;
}